

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::TextFlow::Columns::iterator::iterator(iterator *this,Columns *columns)

{
  pointer *ppcVar1;
  pointer pCVar2;
  iterator __position;
  size_type __n;
  Column *col;
  pointer column;
  const_iterator local_50;
  
  this->m_columns = &columns->m_columns;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = ((long)(columns->m_columns).
               super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(columns->m_columns).
               super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  this->m_activeIterators = __n;
  std::
  vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ::reserve(&this->m_iterators,__n);
  column = (this->m_columns->
           super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->m_columns->
           super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (column != pCVar2) {
    do {
      Column::const_iterator::const_iterator(&local_50,column);
      __position._M_current =
           (this->m_iterators).
           super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_iterators).
          super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
        ::_M_realloc_insert<Catch::TextFlow::Column::const_iterator>
                  (&this->m_iterators,__position,&local_50);
      }
      else {
        (__position._M_current)->m_addHyphen = local_50.m_addHyphen;
        *(undefined7 *)&(__position._M_current)->field_0x21 = local_50._33_7_;
        (__position._M_current)->m_lineLength = local_50.m_lineLength;
        (__position._M_current)->m_parsedTo = local_50.m_parsedTo;
        (__position._M_current)->m_column = local_50.m_column;
        (__position._M_current)->m_lineStart = local_50.m_lineStart;
        ppcVar1 = &(this->m_iterators).
                   super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      column = column + 1;
    } while (column != pCVar2);
  }
  return;
}

Assistant:

Columns::iterator::iterator( Columns const& columns ):
            m_columns( columns.m_columns ),
            m_activeIterators( m_columns.size() ) {

            m_iterators.reserve( m_columns.size() );
            for ( auto const& col : m_columns ) {
                m_iterators.push_back( col.begin() );
            }
        }